

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O1

Am_Object get_icon(char *initial_name,char *obj_name)

{
  char *pcVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Image_Array icon;
  Am_Object AStack_28;
  Am_Image_Array local_20 [8];
  
  pcVar1 = (char *)Am_Merge_Pathname(obj_name);
  Am_Image_Array::Am_Image_Array(local_20);
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&AStack_28,pcVar1);
  Am_Image_Array::operator=(local_20,(Am_Image_Array *)&AStack_28);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&AStack_28);
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  Am_Object::Create((char *)&AStack_28);
  pAVar2 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_20);
  pAVar3 = (Am_Object *)Am_Object::Set((ushort)&AStack_28,(Am_Wrapper *)0xb0,(ulong)pAVar2);
  Am_Object::Am_Object((Am_Object *)initial_name,pAVar3);
  Am_Object::~Am_Object(&AStack_28);
  Am_Image_Array::~Am_Image_Array(local_20);
  return (Am_Object)(Am_Object_Data *)initial_name;
}

Assistant:

static Am_Object
get_icon(const char *initial_name, const char *obj_name)
{
  const char *pathname = Am_Merge_Pathname(initial_name);
  Am_Image_Array icon;
  icon = Am_Image_Array(pathname);
  delete[] pathname;
  return Am_Bitmap.Create(obj_name).Set(Am_IMAGE, icon);
}